

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O0

void __thiscall ipx::BasicLu::_BtranForUpdate(BasicLu *this,Int j,IndexedVector *lhs)

{
  lu_int lVar1;
  logic_error *this_00;
  IndexedVector *in_RDX;
  Int nzlhs;
  Int status;
  double *in_stack_00000200;
  lu_int *in_stack_00000208;
  double *in_stack_00000210;
  lu_int *in_stack_00000218;
  double *in_stack_00000220;
  lu_int *in_stack_00000228;
  lu_int *in_stack_00000240;
  double *in_stack_00000248;
  lu_int in_stack_00000250;
  lu_int *in_stack_00000258;
  double *in_stack_00000260;
  lu_int *in_stack_00000268;
  lu_int *in_stack_00000270;
  double *in_stack_00000278;
  char in_stack_00000280;
  IndexedVector *in_stack_ffffffffffffff40;
  BasicLu *in_stack_ffffffffffffff70;
  
  IndexedVector::set_to_zero(in_stack_ffffffffffffff40);
  while( true ) {
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809aec);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809b02);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809b18);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809b31);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809b47);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809b60);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x809b76);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x809b8d);
    IndexedVector::pattern((IndexedVector *)0x809b9d);
    IndexedVector::elements((IndexedVector *)0x809bb2);
    lVar1 = basiclu_solve_for_update
                      (in_stack_00000228,in_stack_00000220,in_stack_00000218,in_stack_00000210,
                       in_stack_00000208,in_stack_00000200,in_stack_00000240,in_stack_00000248,
                       in_stack_00000250,in_stack_00000258,in_stack_00000260,in_stack_00000268,
                       in_stack_00000270,in_stack_00000278,in_stack_00000280);
    if (lVar1 != 1) break;
    Reallocate(in_stack_ffffffffffffff70);
  }
  if (lVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"basiclu_solve_for_update (btran with lhs) failed");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  IndexedVector::set_nnz(in_RDX,0);
  return;
}

Assistant:

void BasicLu::_BtranForUpdate(Int j, IndexedVector& lhs) {
    Int status;
    Int nzlhs = 0;
    lhs.set_to_zero();
    for (;;) {
        status = basiclu_solve_for_update(istore_.data(), xstore_.data(),
                                          Li_.data(), Lx_.data(),
                                          Ui_.data(), Ux_.data(),
                                          Wi_.data(), Wx_.data(),
                                          0, &j, nullptr,
                                          &nzlhs, lhs.pattern(), lhs.elements(),
                                          'T');
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK)
        throw std::logic_error(
            "basiclu_solve_for_update (btran with lhs) failed");
    lhs.set_nnz(nzlhs);
}